

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyleModel,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcRepresentation *in;
  
  in = (IfcRepresentation *)operator_new(0xa8);
  in[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x0;
  in[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = (_WordT)"IfcStyleModel";
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).field_0x10 = 0;
  *(undefined1 **)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).field_0x18 =
       &in->field_0x28;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).field_0x20 = 0;
  in->field_0x28 = 0;
  in->field_0x38 = 0;
  (in->RepresentationType).ptr._M_dataplus._M_p = (pointer)&(in->RepresentationType).ptr.field_2;
  (in->RepresentationType).ptr._M_string_length = 0;
  (in->RepresentationType).ptr.field_2._M_local_buf[0] = '\0';
  (in->RepresentationType).have = false;
  (in->Items).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in->Items).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in->Items).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcStyleModel_008293e0;
  *(undefined ***)&in->field_0x90 = &PTR__IfcStyleModel_00829430;
  *(undefined ***)&in->field_0x80 = &PTR__IfcStyleModel_00829408;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRepresentation>(db,params,in);
  return (Object *)
         ((long)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
                 _vptr_ObjectHelper +
         (long)(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }